

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::deep_str_abi_cxx11_
          (string *__return_storage_ptr__,
          rt_variable<viennamath::rt_expression_interface<double>> *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  rt_variable<viennamath::rt_expression_interface<double>> *local_18;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = this;
  this_local = (rt_variable<viennamath::rt_expression_interface<double>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"variable(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(this + 8));
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string deep_str() const
      {
        std::stringstream ss;
        ss << "variable(" << id_ << ")";
        return ss.str();
      }